

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O3

void libxml_domnode_binary_insertion_sort_start(xmlNodePtr *dst,size_t start,size_t size)

{
  ulong uVar1;
  xmlNodePtr node1;
  xmlNodePtr node2;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  bool bVar9;
  
  if (start < size) {
    uVar7 = start - 2;
    do {
      node1 = dst[start - 1];
      node2 = dst[start];
      iVar2 = xmlXPathCmpNodesExt(node1,node2);
      if (iVar2 < 0 && iVar2 != -2) {
        iVar2 = xmlXPathCmpNodesExt(node2,*dst);
        uVar4 = uVar7;
        if (iVar2 < 1 && iVar2 != -2) {
          uVar1 = start - 1;
          iVar2 = xmlXPathCmpNodesExt(node2,node1);
          uVar8 = uVar1;
          if (iVar2 != -2 && iVar2 < 0) goto LAB_001b8566;
          uVar8 = uVar1 >> 1;
          uVar6 = 0;
          uVar5 = uVar1;
LAB_001b8504:
          iVar2 = xmlXPathCmpNodesExt(node2,dst[uVar8]);
          if (iVar2 == -2 || 0 < iVar2) {
            uVar3 = uVar8 - uVar6;
            uVar5 = uVar8;
            if (uVar3 < 2) goto LAB_001b8551;
LAB_001b8540:
            uVar8 = (uVar3 >> 1) + uVar6;
            goto LAB_001b8504;
          }
          uVar3 = uVar5 - uVar8;
          uVar6 = uVar8;
          if (1 < uVar3) goto LAB_001b8540;
          uVar8 = uVar8 + 1;
LAB_001b8551:
          if (uVar8 <= uVar1) goto LAB_001b8566;
        }
        else {
          uVar8 = 0;
LAB_001b8566:
          do {
            dst[uVar4 + 2] = dst[uVar4 + 1];
            if (uVar4 == 0xffffffffffffffff) break;
            bVar9 = uVar8 <= uVar4;
            uVar4 = uVar4 - 1;
          } while (bVar9);
        }
        dst[uVar8] = node2;
      }
      start = start + 1;
      uVar7 = uVar7 + 1;
    } while (start != size);
  }
  return;
}

Assistant:

static void BINARY_INSERTION_SORT_START(SORT_TYPE *dst, const size_t start, const size_t size) {
  size_t i;

  for (i = start; i < size; i++) {
    size_t j;
    SORT_TYPE x;
    size_t location;

    /* If this entry is already correct, just move along */
    if (SORT_CMP(dst[i - 1], dst[i]) <= 0) {
      continue;
    }

    /* Else we need to find the right place, shift everything over, and squeeze in */
    x = dst[i];
    location = BINARY_INSERTION_FIND(dst, x, i);

    for (j = i - 1; j >= location; j--) {
      dst[j + 1] = dst[j];

      if (j == 0) { /* check edge case because j is unsigned */
        break;
      }
    }

    dst[location] = x;
  }
}